

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.h
# Opt level: O2

void __thiscall WrapperCommand::execute(WrapperCommand *this,CmdParams *params,CmdContext *context)

{
  int iVar1;
  MappedExe *exe;
  size_t sVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  allocator<char> local_39;
  string local_38;
  
  exe = cmd_util::getMappedExeFromContext(context);
  if (exe != (MappedExe *)0x0) {
    sVar2 = this->wrapperId;
    if (sVar2 == 0xffffffffffffffff) {
      cmd_util::printWrapperNames(exe);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"wrapperNum",&local_39)
      ;
      sVar2 = cmd_util::readNumber(&local_38,false);
      std::__cxx11::string::~string((string *)&local_38);
    }
    iVar1 = (*(exe->super_ExeWrappersContainer)._vptr_ExeWrappersContainer[2])
                      (&exe->super_ExeWrappersContainer,sVar2);
    if (CONCAT44(extraout_var,iVar1) == 0) {
      poVar3 = std::operator<<((ostream *)&std::cout,"No such wrapper!");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      (*(this->super_Command)._vptr_Command[5])(this,CONCAT44(extraout_var,iVar1));
    }
  }
  return;
}

Assistant:

virtual void execute(CmdParams *params, CmdContext  *context)
    {
        MappedExe *mappedExe = cmd_util::getMappedExeFromContext(context);
        if (mappedExe == NULL) return;

        size_t wrId = wrapperId;
        if (wrId == INVALID_WRAPPER) {
            cmd_util::printWrapperNames(mappedExe);
            wrId = cmd_util::readNumber("wrapperNum", false);
        }
        ExeElementWrapper *wrapper = mappedExe->getWrapper(wrId);
        if (wrapper == NULL) {
            std::cout << "No such wrapper!" << std::endl;
            return;
        }
        wrapperAction(wrapper);
    }